

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

void AS_02::ACES::PictureDescriptorDump(PictureDescriptor *PDesc,FILE *stream)

{
  byte bVar1;
  size_type sVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  uint local_1c;
  FILE *pFStack_18;
  ui32_t i;
  FILE *stream_local;
  PictureDescriptor *PDesc_local;
  
  pFStack_18 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    pFStack_18 = _stderr;
  }
  fprintf(pFStack_18,"          EditRate: %i/%i\n",(ulong)(uint)(PDesc->EditRate).Numerator,
          (ulong)(uint)(PDesc->EditRate).Denominator);
  fprintf(pFStack_18,"        SampleRate: %i/%i\n",(ulong)(uint)(PDesc->SampleRate).Numerator,
          (ulong)(uint)(PDesc->SampleRate).Denominator);
  fprintf(pFStack_18,"    Chromaticities: \n");
  fprintf(pFStack_18,"               x_red: %f y_red: %f\n",
          (double)(float)(PDesc->Chromaticities).red.x,(double)(float)(PDesc->Chromaticities).red.y)
  ;
  fprintf(pFStack_18,"             x_green: %f y_green: %f\n",
          (double)(float)(PDesc->Chromaticities).green.x,
          (double)(float)(PDesc->Chromaticities).green.y);
  fprintf(pFStack_18,"              x_blue: %f y_blue: %f\n",
          (double)(float)(PDesc->Chromaticities).blue.x,
          (double)(float)(PDesc->Chromaticities).blue.y);
  fprintf(pFStack_18,"             x_white: %f y_white: %f\n",
          (double)(float)(PDesc->Chromaticities).white.x,
          (double)(float)(PDesc->Chromaticities).white.y);
  fprintf(pFStack_18,"       Compression: %u\n",(ulong)PDesc->Compression);
  fprintf(pFStack_18,"         LineOrder: %u\n",(ulong)PDesc->LineOrder);
  fprintf(pFStack_18,"        DataWindow: \n");
  fprintf(pFStack_18,"                xMin: %i\n",(ulong)(uint)(PDesc->DataWindow).xMin);
  fprintf(pFStack_18,"                yMin: %i\n",(ulong)(uint)(PDesc->DataWindow).yMin);
  fprintf(pFStack_18,"                xMax: %i\n",(ulong)(uint)(PDesc->DataWindow).xMax);
  fprintf(pFStack_18,"                yMax: %i\n",(ulong)(uint)(PDesc->DataWindow).yMax);
  fprintf(pFStack_18,"     DisplayWindow: \n");
  fprintf(pFStack_18,"                xMin: %i\n",(ulong)(uint)(PDesc->DisplayWindow).xMin);
  fprintf(pFStack_18,"                yMin: %i\n",(ulong)(uint)(PDesc->DisplayWindow).yMin);
  fprintf(pFStack_18,"                xMax: %i\n",(ulong)(uint)(PDesc->DisplayWindow).xMax);
  fprintf(pFStack_18,"                yMax: %i\n",(ulong)(uint)(PDesc->DisplayWindow).yMax);
  fprintf(pFStack_18,"  PixelAspectRatio: %f \n",(double)(float)PDesc->PixelAspectRatio);
  fprintf(pFStack_18,"ScreenWindowCenter: x: %f y: %f\n",
          (double)(float)(PDesc->ScreenWindowCenter).x,(double)(float)(PDesc->ScreenWindowCenter).y)
  ;
  fprintf(pFStack_18," ScreenWindowWidth: %f\n",(double)(float)PDesc->ScreenWindowWidth);
  fprintf(pFStack_18,"          Channels: \n");
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::size
                      (&PDesc->Channels);
    if (sVar2 <= local_1c) break;
    std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::operator[]
              (&PDesc->Channels,(ulong)local_1c);
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::operator[]
                (&PDesc->Channels,(ulong)local_1c);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFStack_18,"                Name: %s\n",uVar3);
      pvVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::operator[]
                         (&PDesc->Channels,(ulong)local_1c);
      fprintf(pFStack_18,"           pixelType: %i\n",(ulong)(uint)pvVar4->pixelType);
      pvVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::operator[]
                         (&PDesc->Channels,(ulong)local_1c);
      fprintf(pFStack_18,"             pLinear: %u\n",(ulong)pvVar4->pLinear);
      pvVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::operator[]
                         (&PDesc->Channels,(ulong)local_1c);
      fprintf(pFStack_18,"           xSampling: %i\n",(ulong)(uint)pvVar4->xSampling);
      pvVar4 = std::vector<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>::operator[]
                         (&PDesc->Channels,(ulong)local_1c);
      fprintf(pFStack_18,"           ySampling: %i\n",(ulong)(uint)pvVar4->ySampling);
    }
    local_1c = local_1c + 1;
  }
  sVar2 = std::vector<AS_02::ACES::generic,_std::allocator<AS_02::ACES::generic>_>::size
                    (&PDesc->Other);
  fprintf(pFStack_18,"Number of other entries: %lu\n",sVar2);
  return;
}

Assistant:

void AS_02::ACES::PictureDescriptorDump(const PictureDescriptor &PDesc, FILE *stream /*= NULL*/)
{

  if(stream == NULL) stream = stderr;
  fprintf(stream, "          EditRate: %i/%i\n", PDesc.EditRate.Numerator, PDesc.EditRate.Denominator);
  fprintf(stream, "        SampleRate: %i/%i\n", PDesc.SampleRate.Numerator, PDesc.SampleRate.Denominator);
  fprintf(stream, "    Chromaticities: \n");
  fprintf(stream, "               x_red: %f y_red: %f\n", (double)PDesc.Chromaticities.red.x, (double)PDesc.Chromaticities.red.y);
  fprintf(stream, "             x_green: %f y_green: %f\n", (double)PDesc.Chromaticities.green.x, (double)PDesc.Chromaticities.green.y);
  fprintf(stream, "              x_blue: %f y_blue: %f\n", (double)PDesc.Chromaticities.blue.x, (double)PDesc.Chromaticities.blue.y);
  fprintf(stream, "             x_white: %f y_white: %f\n", (double)PDesc.Chromaticities.white.x, (double)PDesc.Chromaticities.white.y);
  fprintf(stream, "       Compression: %u\n", (unsigned)PDesc.Compression);
  fprintf(stream, "         LineOrder: %u\n", (unsigned)PDesc.LineOrder);
  fprintf(stream, "        DataWindow: \n");
  fprintf(stream, "                xMin: %i\n", PDesc.DataWindow.xMin);
  fprintf(stream, "                yMin: %i\n", PDesc.DataWindow.yMin);
  fprintf(stream, "                xMax: %i\n", PDesc.DataWindow.xMax);
  fprintf(stream, "                yMax: %i\n", PDesc.DataWindow.yMax);
  fprintf(stream, "     DisplayWindow: \n");
  fprintf(stream, "                xMin: %i\n", PDesc.DisplayWindow.xMin);
  fprintf(stream, "                yMin: %i\n", PDesc.DisplayWindow.yMin);
  fprintf(stream, "                xMax: %i\n", PDesc.DisplayWindow.xMax);
  fprintf(stream, "                yMax: %i\n", PDesc.DisplayWindow.yMax);
  fprintf(stream, "  PixelAspectRatio: %f \n", (double)PDesc.PixelAspectRatio);
  fprintf(stream, "ScreenWindowCenter: x: %f y: %f\n", (double)PDesc.ScreenWindowCenter.x, (double)PDesc.ScreenWindowCenter.y);
  fprintf(stream, " ScreenWindowWidth: %f\n", (double)PDesc.ScreenWindowWidth);
  fprintf(stream, "          Channels: \n");

  for(ui32_t i = 0; i < PDesc.Channels.size(); i++)
  {
    if(PDesc.Channels[i].name.empty() == false)
    {
      fprintf(stream, "                Name: %s\n", PDesc.Channels[i].name.c_str());
      fprintf(stream, "           pixelType: %i\n", PDesc.Channels[i].pixelType);
      fprintf(stream, "             pLinear: %u\n", PDesc.Channels[i].pLinear);
      fprintf(stream, "           xSampling: %i\n", PDesc.Channels[i].xSampling);
      fprintf(stream, "           ySampling: %i\n", PDesc.Channels[i].ySampling);
    }
  }
  fprintf(stream, "Number of other entries: %lu\n", PDesc.Other.size());
}